

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tent_dist.hpp
# Opt level: O2

result_type_conflict3 * __thiscall
trng::tent_dist<long_double>::icdf_
          (result_type_conflict3 *__return_storage_ptr__,tent_dist<long_double> *this,
          result_type_conflict3 x)

{
  result_type_conflict3 *prVar1;
  
  if ((longdouble)0.5 <= x._0_10_) {
    prVar1 = (result_type_conflict3 *)sqrtl();
  }
  else {
    prVar1 = (result_type_conflict3 *)sqrtl();
  }
  return prVar1;
}

Assistant:

icdf_(result_type x) const {
      return x < result_type(1) / result_type(2) ? (-1 + math::sqrt(2 * x)) * P.d() + P.m()
                                                 : (1 - math::sqrt(2 - 2 * x)) * P.d() + P.m();
    }